

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull,int *aiMap,int *piTab)

{
  byte *pbVar1;
  undefined8 *puVar2;
  byte bVar3;
  ushort uVar4;
  int iCur;
  u32 uVar5;
  ExprList *pEVar6;
  Select *pSVar7;
  SrcList *pSVar8;
  Table *pTab;
  Index *pIdx;
  Vdbe *p;
  char cVar9;
  bool bVar10;
  u8 uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int target;
  int p3;
  int iVar16;
  int iVar17;
  Vdbe *p_00;
  Expr *pEVar18;
  KeyInfo *p_01;
  CollSeq *pCVar19;
  Expr *pEVar20;
  VdbeOp *pVVar21;
  char aff2;
  long lVar22;
  char *pcVar23;
  Index **ppIVar24;
  long lVar25;
  ExprList_item *pEVar26;
  ulong uVar27;
  ulong uVar28;
  ExprList_item *pEVar29;
  ulong uVar30;
  SrcList **ppSVar31;
  ulong local_80;
  SelectDest dest;
  
  iCur = pParse->nTab;
  pParse->nTab = iCur + 1;
  p_00 = sqlite3GetVdbe(pParse);
  if (prRhsHasNull == (int *)0x0) {
    prRhsHasNull = (int *)0x0;
  }
  else if ((pX->flags & 0x800) != 0) {
    pEVar6 = ((pX->x).pSelect)->pEList;
    uVar14 = pEVar6->nExpr;
    pEVar26 = pEVar6->a;
    uVar27 = 0;
    uVar28 = 0;
    if (0 < (int)uVar14) {
      uVar28 = (ulong)uVar14;
    }
    for (; uVar28 != uVar27; uVar27 = uVar27 + 1) {
      iVar12 = sqlite3ExprCanBeNull(pEVar26->pExpr);
      if (iVar12 != 0) {
        uVar28 = uVar27 & 0xffffffff;
        break;
      }
      pEVar26 = pEVar26 + 1;
    }
    if ((uint)uVar28 == uVar14) {
      prRhsHasNull = (int *)0x0;
    }
  }
  if ((((((pParse->nErr == 0) && ((pX->flags & 0x820) == 0x800)) &&
        (pSVar7 = (pX->x).pSelect, pSVar7->pPrior == (Select *)0x0)) &&
       (((pSVar7->selFlags & 9) == 0 && (pSVar7->pLimit == (Expr *)0x0)))) &&
      ((pSVar7->pWhere == (Expr *)0x0 &&
       ((pSVar8 = pSVar7->pSrc, pSVar8->nSrc == 1 && (pSVar8->a[0].pSelect == (Select *)0x0)))))) &&
     (pTab = pSVar8->a[0].pTab, pTab->nModuleArg == 0)) {
    iVar12 = 1;
    uVar14 = pSVar7->pEList->nExpr;
    pEVar26 = pSVar7->pEList->a;
    uVar27 = 0;
    if (0 < (int)uVar14) {
      uVar27 = (ulong)uVar14;
    }
    lVar25 = 0;
LAB_00190e67:
    if (uVar27 * 0x20 + 0x20 != lVar25 + 0x20) goto code_r0x00190e70;
    iVar13 = sqlite3SchemaToIndex(pParse->db,pTab->pSchema);
    iVar13 = (int)(short)iVar13;
    sqlite3CodeVerifySchema(pParse,iVar13);
    sqlite3TableLock(pParse,iVar13,pTab->tnum,'\0',pTab->zName);
    if ((uVar14 != 1) || (-1 < pEVar26->pExpr->iColumn)) {
      bVar10 = true;
      lVar25 = 0;
      pEVar29 = pEVar26;
      while ((lVar25 < (int)uVar14 && (bVar10))) {
        pEVar18 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)lVar25);
        lVar22 = (long)pEVar29->pExpr->iColumn;
        if (lVar22 < 0) {
          aff2 = 'D';
        }
        else {
          aff2 = pTab->aCol[lVar22].affinity;
        }
        cVar9 = sqlite3CompareAffinity(pEVar18,aff2);
        bVar10 = 'B' < aff2 || (byte)(cVar9 + 0xbfU) < 2;
        lVar25 = lVar25 + 1;
        pEVar29 = pEVar29 + 1;
      }
      if (bVar10) {
        ppIVar24 = &pTab->pIndex;
        iVar12 = 0;
        while ((pIdx = *ppIVar24, pIdx != (Index *)0x0 && (iVar12 == 0))) {
          uVar4 = pIdx->nColumn;
          iVar12 = 0;
          iVar15 = 0;
          if ((((int)uVar14 <= (int)(uint)uVar4) &&
              ((uVar4 < 0x3f && (pIdx->pPartIdxWhere == (Expr *)0x0)))) &&
             ((iVar12 = iVar15, (inFlags & 4) == 0 ||
              (((int)(uint)pIdx->nKeyCol <= (int)uVar14 &&
               ((uVar4 <= uVar14 || (pIdx->onError != '\0')))))))) {
            local_80 = 0;
            for (uVar28 = 0; uVar28 != uVar27; uVar28 = uVar28 + 1) {
              pEVar20 = sqlite3VectorFieldSubexpr(pX->pLeft,(int)uVar28);
              pEVar18 = pEVar26[uVar28].pExpr;
              pCVar19 = sqlite3BinaryCompareCollSeq(pParse,pEVar20,pEVar18);
              uVar30 = 0;
              while( true ) {
                if (uVar14 == uVar30) goto LAB_0019109a;
                if ((pIdx->aiColumn[uVar30] == pEVar18->iColumn) &&
                   ((pCVar19 == (CollSeq *)0x0 ||
                    (iVar15 = sqlite3StrICmp(pCVar19->zName,pIdx->azColl[uVar30]), iVar15 == 0))))
                break;
                uVar30 = uVar30 + 1;
              }
              if ((uVar14 == (uint)uVar30) || ((local_80 >> (uVar30 & 0x3f) & 1) != 0)) break;
              if (aiMap != (int *)0x0) {
                aiMap[uVar28] = (uint)uVar30;
              }
              local_80 = local_80 | 1L << ((byte)uVar30 & 0x3f);
            }
LAB_0019109a:
            if ((local_80 ^ -1L << ((byte)uVar14 & 0x3f)) == 0xffffffffffffffff) {
              iVar12 = sqlite3VdbeAddOp0(p_00,0x11);
              sqlite3VdbeExplain(pParse,'\0',"USING INDEX %s FOR IN-OPERATOR",pIdx->zName);
              sqlite3VdbeAddOp3(p_00,0x6c,iCur,pIdx->tnum,iVar13);
              sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
              bVar3 = *pIdx->aSortOrder;
              if (prRhsHasNull != (int *)0x0) {
                iVar15 = pParse->nMem + 1;
                pParse->nMem = iVar15;
                *prRhsHasNull = iVar15;
                if (uVar14 == 1) {
                  sqlite3SetHasNullFlag(p_00,iCur,iVar15);
                }
              }
              sqlite3VdbeJumpHere(p_00,iVar12);
              iVar12 = bVar3 + 3;
            }
          }
          ppIVar24 = &pIdx->pNext;
        }
        if (iVar12 != 0) goto LAB_00191624;
      }
      goto LAB_00191192;
    }
    iVar15 = sqlite3VdbeAddOp0(p_00,0x11);
    sqlite3OpenTable(pParse,iCur,iVar13,pTab,0x6c);
    sqlite3VdbeExplain(pParse,'\0',"USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR");
    sqlite3VdbeJumpHere(p_00,iVar15);
    goto LAB_00191624;
  }
LAB_00191192:
  if (((inFlags & 1) != 0) && ((pX->flags & 0x800) == 0)) {
    pEVar18 = pX->pLeft;
    pX->pLeft = (Expr *)0x0;
    iVar13 = sqlite3ExprIsConstant(pX);
    pX->pLeft = pEVar18;
    iVar12 = 5;
    if ((iVar13 == 0) || (((pX->x).pList)->nExpr < 3)) goto LAB_00191624;
  }
  uVar5 = pParse->nQueryLoop;
  if ((inFlags & 4) == 0) {
    if (prRhsHasNull == (int *)0x0) goto LAB_001911f9;
    iVar12 = pParse->nMem + 1;
    pParse->nMem = iVar12;
    *prRhsHasNull = iVar12;
  }
  else {
    pParse->nQueryLoop = 0;
LAB_001911f9:
    iVar12 = 0;
  }
  p = pParse->pVdbe;
  uVar14 = pX->flags;
  iVar13 = 0;
  if (((uVar14 & 0x20) == 0) && (iVar13 = 0, pParse->iSelfTab == 0)) {
    if ((uVar14 >> 0x19 & 1) == 0) {
      pX->flags = uVar14 | 0x2000000;
      iVar13 = pParse->nMem + 1;
      pParse->nMem = iVar13;
      (pX->y).sub.regReturn = iVar13;
      iVar13 = sqlite3VdbeAddOp2(p,0x46,0,iVar13);
      (pX->y).sub.iAddr = iVar13 + 1;
      iVar13 = sqlite3VdbeAddOp0(p,0x11);
      goto LAB_0019125b;
    }
    iVar13 = sqlite3VdbeAddOp0(p,0x11);
    if ((pX->flags & 0x800) != 0) {
      sqlite3VdbeExplain(pParse,'\0',"REUSE LIST SUBQUERY %d",(ulong)((pX->x).pSelect)->selId);
    }
    sqlite3VdbeAddOp2(p,0xc,(pX->y).sub.regReturn,(pX->y).sub.iAddr);
    sqlite3VdbeAddOp2(p,0x6f,iCur,pX->iTable);
    sqlite3VdbeJumpHere(p,iVar13);
  }
  else {
LAB_0019125b:
    pEVar18 = pX->pLeft;
    uVar14 = sqlite3ExprVectorSize(pEVar18);
    pX->iTable = iCur;
    iVar15 = sqlite3VdbeAddOp2(p,0x71,iCur,uVar14);
    p_01 = sqlite3KeyInfoAlloc(pParse->db,uVar14,1);
    pSVar7 = (pX->x).pSelect;
    if ((pX->flags & 0x800) == 0) {
      if (pSVar7 != (Select *)0x0) {
        uVar11 = sqlite3ExprAffinity(pEVar18);
        dest.eDest = 'A';
        if (uVar11 != '\0') {
          dest.eDest = uVar11;
        }
        if (p_01 != (KeyInfo *)0x0) {
          pCVar19 = sqlite3ExprCollSeq(pParse,pX->pLeft);
          p_01->aColl[0] = pCVar19;
        }
        target = sqlite3GetTempReg(pParse);
        p3 = sqlite3GetTempReg(pParse);
        ppSVar31 = (SrcList **)&pSVar7->op;
        for (iVar17 = *(int *)&pSVar7->pEList; 0 < iVar17; iVar17 = iVar17 + -1) {
          pSVar8 = *ppSVar31;
          if (iVar13 == 0) {
LAB_0019135d:
            iVar13 = 0;
          }
          else {
            iVar16 = sqlite3ExprIsConstant((Expr *)pSVar8);
            if (iVar16 == 0) {
              sqlite3VdbeChangeToNoop(p,iVar13);
              pbVar1 = (byte *)((long)&pX->flags + 3);
              *pbVar1 = *pbVar1 & 0xfd;
              goto LAB_0019135d;
            }
          }
          iVar16 = sqlite3ExprCodeTarget(pParse,(Expr *)pSVar8,target);
          sqlite3VdbeAddOp4(p,0x5c,iVar16,1,p3,(char *)&dest,1);
          sqlite3VdbeAddOp4Int(p,0x84,iCur,p3,iVar16,1);
          ppSVar31 = ppSVar31 + 4;
        }
        if (target != 0) {
          bVar3 = pParse->nTempReg;
          if ((ulong)bVar3 < 8) {
            pParse->nTempReg = bVar3 + 1;
            pParse->aTempReg[bVar3] = target;
          }
        }
        if (p3 != 0) {
          bVar3 = pParse->nTempReg;
          if ((ulong)bVar3 < 8) {
            pParse->nTempReg = bVar3 + 1;
            pParse->aTempReg[bVar3] = p3;
          }
        }
      }
    }
    else {
      pEVar6 = pSVar7->pEList;
      pcVar23 = "";
      if (iVar13 == 0) {
        pcVar23 = "CORRELATED ";
      }
      sqlite3VdbeExplain(pParse,'\x01',"%sLIST SUBQUERY %d",pcVar23,(ulong)pSVar7->selId);
      if (pEVar6->nExpr == uVar14) {
        dest.eDest = '\v';
        dest.iSdst = 0;
        dest.nSdst = 0;
        dest.iSDParm = iCur;
        dest.zAffSdst = exprINAffinity(pParse,pX);
        pSVar7->iLimit = 0;
        iVar17 = sqlite3Select(pParse,pSVar7,&dest);
        sqlite3DbFree(pParse->db,dest.zAffSdst);
        if (iVar17 != 0) {
          sqlite3KeyInfoUnref(p_01);
          goto LAB_00191601;
        }
        pEVar26 = pEVar6->a;
        uVar28 = 0;
        uVar27 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar27 = uVar28;
        }
        for (; uVar27 != uVar28; uVar28 = uVar28 + 1) {
          pEVar20 = sqlite3VectorFieldSubexpr(pEVar18,(int)uVar28);
          pCVar19 = sqlite3BinaryCompareCollSeq(pParse,pEVar20,pEVar26->pExpr);
          p_01->aColl[uVar28] = pCVar19;
          pEVar26 = pEVar26 + 1;
        }
      }
    }
    if (p_01 != (KeyInfo *)0x0) {
      sqlite3VdbeChangeP4(p,iVar15,(char *)p_01,-9);
    }
    if (iVar13 != 0) {
      sqlite3VdbeJumpHere(p,iVar13);
      sqlite3VdbeAddOp1(p,0x42,(pX->y).sub.regReturn);
      iVar13 = p->nOp;
      pVVar21 = sqlite3VdbeGetOp(p,(pX->y).sub.iAddr + -1);
      pVVar21->p1 = iVar13 + -1;
    }
  }
LAB_00191601:
  if (iVar12 != 0) {
    sqlite3SetHasNullFlag(p_00,iCur,iVar12);
  }
  pParse->nQueryLoop = uVar5;
  iVar12 = 2;
LAB_00191624:
  if ((aiMap != (int *)0x0) && (iVar12 - 5U < 0xfffffffe)) {
    uVar14 = sqlite3ExprVectorSize(pX->pLeft);
    uVar28 = 0;
    uVar27 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar27 = uVar28;
    }
    for (; uVar27 != uVar28; uVar28 = uVar28 + 1) {
      aiMap[uVar28] = (int)uVar28;
    }
  }
  *piTab = iCur;
  return iVar12;
code_r0x00190e70:
  puVar2 = (undefined8 *)((long)&pEVar26->pExpr + lVar25);
  lVar25 = lVar25 + 0x20;
  if (*(char *)*puVar2 != -0x5e) goto LAB_00191192;
  goto LAB_00190e67;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(
  Parse *pParse,             /* Parsing context */
  Expr *pX,                  /* The right-hand side (RHS) of the IN operator */
  u32 inFlags,               /* IN_INDEX_LOOP, _MEMBERSHIP, and/or _NOOP_OK */
  int *prRhsHasNull,         /* Register holding NULL status.  See notes */
  int *aiMap,                /* Mapping from Index fields to RHS fields */
  int *piTab                 /* OUT: index to use */
){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;

  /* If the RHS of this IN(...) operator is a SELECT, and if it matters 
  ** whether or not the SELECT result contains NULL values, check whether
  ** or not NULL is actually possible (it may not be, for example, due 
  ** to NOT NULL constraints in the schema). If no NULL values are possible,
  ** set prRhsHasNull to 0 before continuing.  */
  if( prRhsHasNull && (pX->flags & EP_xIsSelect) ){
    int i;
    ExprList *pEList = pX->x.pSelect->pEList;
    for(i=0; i<pEList->nExpr; i++){
      if( sqlite3ExprCanBeNull(pEList->a[i].pExpr) ) break;
    }
    if( i==pEList->nExpr ){
      prRhsHasNull = 0;
    }
  }

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.  */
  if( pParse->nErr==0 && (p = isCandidateForInOpt(pX))!=0 ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    i16 iDb;                               /* Database idx for pTab */
    ExprList *pEList = p->pEList;
    int nExpr = pEList->nExpr;

    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;

    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    assert(v);  /* sqlite3GetVdbe() has always been previously called */
    if( nExpr==1 && pEList->a[0].pExpr->iColumn<0 ){
      /* The "x IN (SELECT rowid FROM table)" case */
      int iAddr = sqlite3VdbeAddOp0(v, OP_Once);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;
      ExplainQueryPlan((pParse, 0,
            "USING ROWID SEARCH ON TABLE %s FOR IN-OPERATOR",pTab->zName));
      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */
      int affinity_ok = 1;
      int i;

      /* Check that the affinity that will be used to perform each 
      ** comparison is the same as the affinity of each column in table
      ** on the RHS of the IN operator.  If it not, it is not possible to
      ** use any index of the RHS table.  */
      for(i=0; i<nExpr && affinity_ok; i++){
        Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
        int iCol = pEList->a[i].pExpr->iColumn;
        char idxaff = sqlite3TableColumnAffinity(pTab,iCol); /* RHS table */
        char cmpaff = sqlite3CompareAffinity(pLhs, idxaff);
        testcase( cmpaff==SQLITE_AFF_BLOB );
        testcase( cmpaff==SQLITE_AFF_TEXT );
        switch( cmpaff ){
          case SQLITE_AFF_BLOB:
            break;
          case SQLITE_AFF_TEXT:
            /* sqlite3CompareAffinity() only returns TEXT if one side or the
            ** other has no affinity and the other side is TEXT.  Hence,
            ** the only way for cmpaff to be TEXT is for idxaff to be TEXT
            ** and for the term on the LHS of the IN to have no affinity. */
            assert( idxaff==SQLITE_AFF_TEXT );
            break;
          default:
            affinity_ok = sqlite3IsNumericAffinity(idxaff);
        }
      }

      if( affinity_ok ){
        /* Search for an existing index that will work for this IN operator */
        for(pIdx=pTab->pIndex; pIdx && eType==0; pIdx=pIdx->pNext){
          Bitmask colUsed;      /* Columns of the index used */
          Bitmask mCol;         /* Mask for the current column */
          if( pIdx->nColumn<nExpr ) continue;
          if( pIdx->pPartIdxWhere!=0 ) continue;
          /* Maximum nColumn is BMS-2, not BMS-1, so that we can compute
          ** BITMASK(nExpr) without overflowing */
          testcase( pIdx->nColumn==BMS-2 );
          testcase( pIdx->nColumn==BMS-1 );
          if( pIdx->nColumn>=BMS-1 ) continue;
          if( mustBeUnique ){
            if( pIdx->nKeyCol>nExpr
             ||(pIdx->nColumn>nExpr && !IsUniqueIndex(pIdx))
            ){
              continue;  /* This index is not unique over the IN RHS columns */
            }
          }
  
          colUsed = 0;   /* Columns of index used so far */
          for(i=0; i<nExpr; i++){
            Expr *pLhs = sqlite3VectorFieldSubexpr(pX->pLeft, i);
            Expr *pRhs = pEList->a[i].pExpr;
            CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pLhs, pRhs);
            int j;
  
            assert( pReq!=0 || pRhs->iColumn==XN_ROWID || pParse->nErr );
            for(j=0; j<nExpr; j++){
              if( pIdx->aiColumn[j]!=pRhs->iColumn ) continue;
              assert( pIdx->azColl[j] );
              if( pReq!=0 && sqlite3StrICmp(pReq->zName, pIdx->azColl[j])!=0 ){
                continue;
              }
              break;
            }
            if( j==nExpr ) break;
            mCol = MASKBIT(j);
            if( mCol & colUsed ) break; /* Each column used only once */
            colUsed |= mCol;
            if( aiMap ) aiMap[i] = j;
          }
  
          assert( i==nExpr || colUsed!=(MASKBIT(nExpr)-1) );
          if( colUsed==(MASKBIT(nExpr)-1) ){
            /* If we reach this point, that means the index pIdx is usable */
            int iAddr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
            ExplainQueryPlan((pParse, 0,
                              "USING INDEX %s FOR IN-OPERATOR",pIdx->zName));
            sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
            sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
            VdbeComment((v, "%s", pIdx->zName));
            assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
            eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];
  
            if( prRhsHasNull ){
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
              i64 mask = (1<<nExpr)-1;
              sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, 
                  iTab, 0, 0, (u8*)&mask, P4_INT64);
#endif
              *prRhsHasNull = ++pParse->nMem;
              if( nExpr==1 ){
                sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
              }
            }
            sqlite3VdbeJumpHere(v, iAddr);
          }
        } /* End loop over indexes */
      } /* End if( affinity_ok ) */
    } /* End if not an rowid index */
  } /* End attempt to optimize using an index */

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not constant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && !ExprHasProperty(pX, EP_xIsSelect)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    eType = IN_INDEX_NOOP;
  }

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    assert( pX->op==TK_IN );
    sqlite3CodeRhsOfIN(pParse, pX, iTab);
    if( rMayHaveNull ){
      sqlite3SetHasNullFlag(v, iTab, rMayHaveNull);
    }
    pParse->nQueryLoop = savedNQueryLoop;
  }

  if( aiMap && eType!=IN_INDEX_INDEX_ASC && eType!=IN_INDEX_INDEX_DESC ){
    int i, n;
    n = sqlite3ExprVectorSize(pX->pLeft);
    for(i=0; i<n; i++) aiMap[i] = i;
  }
  *piTab = iTab;
  return eType;
}